

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.cpp
# Opt level: O1

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::apply
          (Phase<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  anon_class_16_2_357f297d f;
  anon_class_16_2_357f297d local_38;
  
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[3])();
  local_38.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  if (op == ConjTrans) {
    local_38.lambda._M_value = (ulong)this->angle_ ^ 0x8000000000000000;
  }
  else {
    local_38.lambda._M_value = *(_ComplexT *)&this->angle_;
  }
  apply2b<qclab::qgates::lambda_Phase<std::complex<float>>(qclab::Op,std::complex<float>&,std::complex<float>*)::_lambda(unsigned_long)_1_>
            (nbQubits,iVar1 + offset,&local_38);
  return;
}

Assistant:

void Phase< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    T lambda = T( cos() , sin() ) ;
    auto f = lambda_Phase( op , lambda , vector.data() ) ;
    apply2b( nbQubits , qubit , f ) ;
  }